

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.h
# Opt level: O2

void __thiscall
rpn::VarRefExpression<rpn::EnvVarRefExpression>::Evaluate
          (VarRefExpression<rpn::EnvVarRefExpression> *this,EvaluationContext *context)

{
  string variableValue;
  string sStack_38;
  
  ConcatExpression::Evaluate(&this->super_ConcatExpression,context);
  EnvVarRefExpression::GetVariableValue
            (&sStack_38,(EnvVarRefExpression *)this,
             (context->results).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1);
  std::__cxx11::string::operator=
            ((string *)
             ((context->results).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish + -1),(string *)&sStack_38);
  (context->resultsCount).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish[-1] = 1;
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void Evaluate(EvaluationContext& context) const override
    {
        ConcatExpression::Evaluate(context);

        const auto& variableName = context.results.back();
        auto variableValue =
            static_cast<const T&>(*this).GetVariableValue(variableName);

        // since we know that we need to push/pop exactly one argument to/from
        // both stacks, we can just rewrite last element
        context.results.back() = std::move(variableValue);
        context.resultsCount.back() = 1;
    }